

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O2

void * qemu_map_ram_ptr_x86_64(uc_struct_conflict *uc,RAMBlock *ram_block,ram_addr_t addr)

{
  void *pvVar1;
  
  if (ram_block == (RAMBlock *)0x0) {
    ram_block = qemu_get_ram_block(uc,addr);
    addr = addr - ram_block->offset;
  }
  pvVar1 = ramblock_ptr(ram_block,addr);
  return pvVar1;
}

Assistant:

void *qemu_map_ram_ptr(struct uc_struct *uc, RAMBlock *ram_block, ram_addr_t addr)
{
    RAMBlock *block = ram_block;

    if (block == NULL) {
        block = qemu_get_ram_block(uc, addr);
        addr -= block->offset;
    }

    return ramblock_ptr(block, addr);
}